

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_ring_buffer.cc
# Opt level: O3

void __thiscall
webrtc::AudioRingBuffer::MoveReadPositionBackward(AudioRingBuffer *this,size_t frames)

{
  pointer ppRVar1;
  int iVar2;
  string *result;
  pointer ppRVar3;
  size_t moved;
  size_t local_1b0;
  size_t local_1a8;
  FatalMessage local_1a0;
  
  ppRVar3 = (this->buffers_).super__Vector_base<RingBuffer_*,_std::allocator<RingBuffer_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ppRVar1 = (this->buffers_).super__Vector_base<RingBuffer_*,_std::allocator<RingBuffer_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  if (ppRVar3 != ppRVar1) {
    local_1b0 = frames;
    do {
      iVar2 = WebRtc_MoveReadPtr(*ppRVar3,-(int)local_1b0);
      local_1a8 = (size_t)-iVar2;
      if (local_1b0 != local_1a8) {
        result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                           (&local_1a8,&local_1b0,"moved == frames");
        if (result != (string *)0x0) {
          rtc::FatalMessage::FatalMessage
                    (&local_1a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/audio_ring_buffer.cc"
                     ,0x47,result);
          rtc::FatalMessage::~FatalMessage(&local_1a0);
        }
      }
      ppRVar3 = ppRVar3 + 1;
    } while (ppRVar3 != ppRVar1);
  }
  return;
}

Assistant:

void AudioRingBuffer::MoveReadPositionBackward(size_t frames) {
  for (auto buf : buffers_) {
    const size_t moved = static_cast<size_t>(
        -WebRtc_MoveReadPtr(buf, -static_cast<int>(frames)));
    RTC_CHECK_EQ(moved, frames);
  }
}